

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

void chaiscript::Boxed_Number::check_divide_by_zero<long>(long t)

{
  arithmetic_error *this;
  allocator<char> local_31;
  string local_30;
  long local_10;
  long t_local;
  
  if (t == 0) {
    local_10 = t;
    this = (arithmetic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"divide by zero",&local_31);
    exception::arithmetic_error::arithmetic_error(this,&local_30);
    __cxa_throw(this,&exception::arithmetic_error::typeinfo,
                exception::arithmetic_error::~arithmetic_error);
  }
  return;
}

Assistant:

constexpr static inline void check_divide_by_zero([[maybe_unused]] T t) {
#ifndef CHAISCRIPT_NO_PROTECT_DIVIDEBYZERO
      if constexpr (!std::is_floating_point<T>::value) {
        if (t == 0) {
          throw chaiscript::exception::arithmetic_error("divide by zero");
        }
      }
#endif
    }